

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O2

void __thiscall
wasm::FunctionHasher::FunctionHasher(FunctionHasher *this,Map *output,ExprHasher *customHasher)

{
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
  ).super_Pass.runner = (PassRunner *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
  ).super_Pass.name._M_dataplus._M_p =
       (pointer)&(this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
                 ).super_Pass.name.field_2;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
  ).super_Pass.name._M_string_length = 0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
  ).super_Pass.name.field_2._M_local_buf[0] = '\0';
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
  ).super_PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.
  super_Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.replacep =
       (Expression **)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
  ).super_PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.
  super_Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.stack.usedFixed = 0
  ;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
  ).super_PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.
  super_Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>::Task,_std::allocator<wasm::Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
           ).super_PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.
           super_Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>::Task,_std::allocator<wasm::Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>::Task>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
           ).super_PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.
           super_Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>::Task,_std::allocator<wasm::Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>::Task>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
  ).super_PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.
  super_Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.currFunction =
       (Function *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
  ).super_PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.
  super_Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.currModule =
       (Module *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__FunctionHasher_00e1e3c0;
  this->output = output;
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::function
            (&this->customHasher,customHasher);
  return;
}

Assistant:

FunctionHasher(Map* output, ExpressionAnalyzer::ExprHasher customHasher)
    : output(output), customHasher(customHasher) {}